

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void blake2b_reset(ssh_hash *hash)

{
  BinarySink **__dest;
  blake2b *s;
  ssh_hash *hash_local;
  
  __dest = &hash[-0x10].binarysink_;
  memcpy(__dest,iv,0x40);
  *__dest = (BinarySink *)((ulong)(*(uint *)&hash[-0xc].binarysink_ ^ 0x1010000) ^ (ulong)*__dest);
  hash[-3].vt = (ssh_hashalg *)0x0;
  hash[-2].vt = (ssh_hashalg *)0x0;
  hash[-3].binarysink_ = (BinarySink *)0x0;
  return;
}

Assistant:

static void blake2b_reset(ssh_hash *hash)
{
    blake2b *s = container_of(hash, blake2b, hash);

    /* Initialise the hash to the standard IV */
    memcpy(s->h, iv, sizeof(s->h));

    /* XOR in the parameters: secret key length (here always 0) in
     * byte 1, and hash length in byte 0. */
    s->h[0] ^= 0x01010000 ^ s->hashlen;

    s->used = 0;
    s->lenhi = s->lenlo = 0;
}